

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O0

void __thiscall irr::CIrrDeviceSDL::logAttributes(CIrrDeviceSDL *this)

{
  int iVar1;
  Printer *this_00;
  double __x;
  int value;
  stringc sdl_attr;
  string<char> *in_stack_fffffffffffffc68;
  string<char> *in_stack_fffffffffffffc70;
  string<char> *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  string<char> *in_stack_fffffffffffffc90;
  undefined4 local_2c [11];
  
  core::string<char>::string<char>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  local_2c[0] = 0;
  iVar1 = SDL_GL_GetAttribute(0,local_2c);
  if (iVar1 == 0) {
    core::string<char>::string<char>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    core::string<char>::string(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    core::string<char>::operator+
              ((string<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    core::string<char>::operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    core::string<char>::~string((string<char> *)0x38f62d);
    core::string<char>::~string((string<char> *)0x38f63a);
    core::string<char>::~string((string<char> *)0x38f647);
  }
  iVar1 = SDL_GL_GetAttribute(1,local_2c);
  if (iVar1 == 0) {
    core::string<char>::string<char>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    core::string<char>::string(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    core::string<char>::operator+
              ((string<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    core::string<char>::operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    core::string<char>::~string((string<char> *)0x38f6c9);
    core::string<char>::~string((string<char> *)0x38f6d6);
    core::string<char>::~string((string<char> *)0x38f6e3);
  }
  iVar1 = SDL_GL_GetAttribute(2,local_2c);
  if (iVar1 == 0) {
    core::string<char>::string<char>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    core::string<char>::string(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    core::string<char>::operator+
              ((string<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    core::string<char>::operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    core::string<char>::~string((string<char> *)0x38f765);
    core::string<char>::~string((string<char> *)0x38f772);
    core::string<char>::~string((string<char> *)0x38f77f);
  }
  iVar1 = SDL_GL_GetAttribute(3,local_2c);
  if (iVar1 == 0) {
    core::string<char>::string<char>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    core::string<char>::string(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    core::string<char>::operator+
              ((string<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    core::string<char>::operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    core::string<char>::~string((string<char> *)0x38f801);
    core::string<char>::~string((string<char> *)0x38f80e);
    core::string<char>::~string((string<char> *)0x38f81b);
  }
  iVar1 = SDL_GL_GetAttribute(6,local_2c);
  if (iVar1 == 0) {
    core::string<char>::string<char>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    core::string<char>::string(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    core::string<char>::operator+
              ((string<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    core::string<char>::operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    core::string<char>::~string((string<char> *)0x38f89d);
    core::string<char>::~string((string<char> *)0x38f8aa);
    core::string<char>::~string((string<char> *)0x38f8b7);
  }
  iVar1 = SDL_GL_GetAttribute(7,local_2c);
  if (iVar1 == 0) {
    core::string<char>::string<char>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    core::string<char>::string(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    core::string<char>::operator+
              ((string<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    core::string<char>::operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    core::string<char>::~string((string<char> *)0x38f939);
    core::string<char>::~string((string<char> *)0x38f946);
    core::string<char>::~string((string<char> *)0x38f953);
  }
  iVar1 = SDL_GL_GetAttribute(5,local_2c);
  if (iVar1 == 0) {
    core::string<char>::string<char>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    core::string<char>::string(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    core::string<char>::operator+
              ((string<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    core::string<char>::operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    core::string<char>::~string((string<char> *)0x38f9d5);
    core::string<char>::~string((string<char> *)0x38f9e2);
    core::string<char>::~string((string<char> *)0x38f9ef);
  }
  iVar1 = SDL_GL_GetAttribute(0xd,local_2c);
  if (iVar1 == 0) {
    core::string<char>::string<char>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    core::string<char>::string(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    core::string<char>::operator+
              ((string<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    core::string<char>::operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    core::string<char>::~string((string<char> *)0x38fa67);
    core::string<char>::~string((string<char> *)0x38fa71);
    core::string<char>::~string((string<char> *)0x38fa7e);
  }
  iVar1 = SDL_GL_GetAttribute(0xe,local_2c);
  if (iVar1 == 0) {
    core::string<char>::string<char>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    core::string<char>::string(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    core::string<char>::operator+
              ((string<char> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    core::string<char>::operator+=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    core::string<char>::~string((string<char> *)0x38fae7);
    core::string<char>::~string((string<char> *)0x38faf1);
    core::string<char>::~string((string<char> *)0x38fafb);
  }
  this_00 = (Printer *)core::string<char>::c_str((string<char> *)0x38fb08);
  os::Printer::log(this_00,__x);
  core::string<char>::~string((string<char> *)0x38fb22);
  return;
}

Assistant:

void CIrrDeviceSDL::logAttributes()
{
	core::stringc sdl_attr("SDL attribs:");
	int value = 0;
	if (SDL_GL_GetAttribute(SDL_GL_RED_SIZE, &value) == 0)
		sdl_attr += core::stringc(" r:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_GREEN_SIZE, &value) == 0)
		sdl_attr += core::stringc(" g:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_BLUE_SIZE, &value) == 0)
		sdl_attr += core::stringc(" b:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_ALPHA_SIZE, &value) == 0)
		sdl_attr += core::stringc(" a:") + core::stringc(value);

	if (SDL_GL_GetAttribute(SDL_GL_DEPTH_SIZE, &value) == 0)
		sdl_attr += core::stringc(" depth:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_STENCIL_SIZE, &value) == 0)
		sdl_attr += core::stringc(" stencil:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_DOUBLEBUFFER, &value) == 0)
		sdl_attr += core::stringc(" doublebuf:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_MULTISAMPLEBUFFERS, &value) == 0)
		sdl_attr += core::stringc(" aa:") + core::stringc(value);
	if (SDL_GL_GetAttribute(SDL_GL_MULTISAMPLESAMPLES, &value) == 0)
		sdl_attr += core::stringc(" aa-samples:") + core::stringc(value);

	os::Printer::log(sdl_attr.c_str());
}